

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferBlending::iterate
          (GeometryShaderLayeredFramebufferBlending *this)

{
  ostringstream *this_00;
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  byte bVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  GLuint GVar10;
  deUint32 dVar11;
  undefined4 extraout_var;
  TestError *this_01;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  long lVar16;
  pointer_____offset_0x10___ *ppuVar17;
  long lVar18;
  uchar **ppuVar19;
  uchar *puVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  char *gs_code;
  char *fs_code;
  uchar *slice_pixels_ptr_1 [4];
  undefined1 local_408 [16];
  uchar buffer_slice4 [64];
  uchar buffer_slice3 [64];
  uchar buffer_slice2 [64];
  uchar buffer_slice1 [64];
  uchar *slice_pixels_ptr [4];
  uchar ref_buffer_slice4 [64];
  uchar ref_buffer_slice3 [64];
  uchar ref_buffer_slice2 [64];
  uchar ref_buffer_slice1 [64];
  uchar buffer [64];
  long lVar12;
  
  fs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(0.2);\n}\n"
  ;
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout(points)                          in;\nlayout(triangle_strip, max_vertices=64) out;\n\nvoid main()\n{\n    for (int n = 0; n < 4; ++n)\n    {\n        gl_Layer    = n;\n        gl_Position = vec4(1, 1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(1, -1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, 1, 0, 1);\n        EmitVertex();\n\n        gl_Layer    = n;\n        gl_Position = vec4(-1, -1, 0, 1);\n        EmitVertex();\n\n        EndPrimitive();\n    }\n}\n"
  ;
  iVar9 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar9);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0xb9);
    ppuVar17 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    GVar10 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar10;
    GVar10 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
    ;
    this->m_gs_id = GVar10;
    GVar10 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar10;
    dVar11 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar11,"Could not generate shader objects",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0xc1);
    GVar10 = (**(code **)(lVar12 + 0x3c8))();
    this->m_po_id = GVar10;
    bVar8 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,GVar10,this->m_fs_id,1,&fs_code,this->m_gs_id,1,
                       &gs_code,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code,(bool *)0x0);
    if (bVar8) {
      for (lVar18 = 0; auVar7 = _DAT_016f3560, lVar18 != 0x10; lVar18 = lVar18 + 1) {
        slice_pixels_ptr[0] = buffer_slice1 + lVar18 * 4;
        slice_pixels_ptr[1] = buffer_slice2 + lVar18 * 4;
        slice_pixels_ptr[2] = buffer_slice3 + lVar18 * 4;
        slice_pixels_ptr[3] = buffer_slice4 + lVar18 * 4;
        ppuVar19 = slice_pixels_ptr;
        for (uVar13 = 0; uVar13 != 0x3fc; uVar13 = uVar13 + 0xff) {
          puVar20 = *ppuVar19;
          *puVar20 = '\0';
          puVar20[1] = (uchar)(uVar13 >> 2);
          puVar20[2] = (uchar)(uVar13 >> 3);
          puVar20[3] = (uchar)((ushort)uVar13 / 0xc);
          ppuVar19 = ppuVar19 + 1;
        }
      }
      for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
        slice_pixels_ptr[0] = ref_buffer_slice1 + lVar18 * 4;
        slice_pixels_ptr[1] = ref_buffer_slice2 + lVar18 * 4;
        slice_pixels_ptr[2] = ref_buffer_slice3 + lVar18 * 4;
        slice_pixels_ptr[3] = ref_buffer_slice4 + lVar18 * 4;
        slice_pixels_ptr_1[0] = buffer_slice1 + lVar18 * 4;
        slice_pixels_ptr_1[1] = buffer_slice2 + lVar18 * 4;
        slice_pixels_ptr_1[2] = buffer_slice3 + lVar18 * 4;
        slice_pixels_ptr_1[3] = buffer_slice4 + lVar18 * 4;
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          puVar20 = slice_pixels_ptr[lVar14];
          uVar1 = *(undefined4 *)slice_pixels_ptr_1[lVar14];
          uVar13 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
          auVar2._8_4_ = 0;
          auVar2._0_8_ = uVar13;
          auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
          auVar3[8] = (char)((uint)uVar1 >> 0x10);
          auVar3._0_8_ = uVar13;
          auVar3[9] = 0;
          auVar3._10_3_ = auVar2._10_3_;
          auVar5._5_8_ = 0;
          auVar5._0_5_ = auVar3._8_5_;
          auVar4[4] = (char)((uint)uVar1 >> 8);
          auVar4._0_4_ = (int)uVar13;
          auVar4[5] = 0;
          auVar4._6_7_ = SUB137(auVar5 << 0x40,6);
          auVar22._0_4_ = (float)(int)uVar13;
          auVar22._4_4_ = (float)auVar4._4_4_;
          auVar22._8_4_ = (float)auVar3._8_4_;
          auVar22._12_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10);
          local_408 = divps(auVar22,auVar7);
          for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
            fVar21 = *(float *)(local_408 + lVar16 * 4) * *(float *)(local_408 + lVar16 * 4) +
                     0.16000001;
            fVar23 = 1.0;
            if (fVar21 <= 1.0) {
              fVar23 = fVar21;
            }
            puVar20[lVar16] = (uchar)(int)(fVar23 * 255.0);
          }
        }
      }
      (**(code **)(lVar12 + 0x6f8))(1);
      (**(code **)(lVar12 + 0xb8))(0x806f,this->m_to_id);
      (**(code **)(lVar12 + 0x1398))(0x806f,1,0x8058,4,4,4);
      (**(code **)(lVar12 + 0x13c0))(0x806f,0,0,0,0,4,4,1,0x1908,0x1401,buffer_slice1);
      (**(code **)(lVar12 + 0x13c0))(0x806f,0,0,0,1,4,4,1,0x1908,0x1401,buffer_slice2);
      (**(code **)(lVar12 + 0x13c0))(0x806f,0,0,0,2,4,4,1,0x1908,0x1401,buffer_slice3);
      (**(code **)(lVar12 + 0x13c0))(0x806f,0,0,0,3,4,4,1,0x1908,0x1401,buffer_slice4);
      dVar11 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar11,"Could not set up texture object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x117);
      (**(code **)(lVar12 + 0x6d0))(1,&this->m_fbo_id);
      (**(code **)(lVar12 + 0x78))(0x8ca9,this->m_fbo_id);
      (**(code **)(lVar12 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,0);
      dVar11 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar11,"Could not set up draw framebuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x11f);
      (**(code **)(lVar12 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar12 + 0xd8))(this->m_vao_id);
      dVar11 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar11,"Could not set up vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x125);
      (**(code **)(lVar12 + 0x120))(0x301,0x306);
      (**(code **)(lVar12 + 0x5e0))(0xbe2);
      (**(code **)(lVar12 + 0x1680))(this->m_po_id);
      (**(code **)(lVar12 + 0x1a00))(0,0,4,4);
      (**(code **)(lVar12 + 0x538))(0,0,1);
      dVar11 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar11,"Draw call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                      ,0x131);
      (**(code **)(lVar12 + 0x6d0))(1,&this->m_read_fbo_id);
      (**(code **)(lVar12 + 0x78))(0x8ca8);
      lVar18 = 0;
      this_00 = (ostringstream *)(slice_pixels_ptr + 1);
      do {
        if (lVar18 == 4) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          return STOP;
        }
        puVar20 = ref_buffer_slice4;
        if (lVar18 == 2) {
          puVar20 = ref_buffer_slice3;
        }
        if (lVar18 == 1) {
          puVar20 = ref_buffer_slice2;
        }
        if (lVar18 == 0) {
          puVar20 = ref_buffer_slice1;
        }
        (**(code **)(lVar12 + 0x6b8))(0x8ca8,0x8ce0,this->m_to_id,0);
        (**(code **)(lVar12 + 0x1220))(0,0,4,4,0x1908,0x1401,buffer);
        dVar11 = (**(code **)(lVar12 + 0x800))();
        glu::checkError(dVar11,"Could not read back pixel data!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                        ,0x143);
        uVar13 = (ulong)puVar20 | 3;
        puVar20 = buffer + 3;
        bVar8 = false;
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
            iVar9 = (uint)puVar20[lVar16 * 4 + -3] - (uint)*(byte *)((uVar13 - 3) + lVar16 * 4);
            bVar6 = (byte)iVar9;
            bVar15 = -bVar6;
            if (0 < iVar9) {
              bVar15 = bVar6;
            }
            if (bVar15 < 2) {
              iVar9 = (uint)puVar20[lVar16 * 4 + -2] - (uint)*(byte *)((uVar13 - 2) + lVar16 * 4);
              bVar6 = (byte)iVar9;
              bVar15 = -bVar6;
              if (0 < iVar9) {
                bVar15 = bVar6;
              }
              if (1 < bVar15) goto LAB_00ce3e01;
              iVar9 = (uint)puVar20[lVar16 * 4 + -1] - (uint)*(byte *)((uVar13 - 1) + lVar16 * 4);
              bVar6 = (byte)iVar9;
              bVar15 = -bVar6;
              if (0 < iVar9) {
                bVar15 = bVar6;
              }
              if (1 < bVar15) goto LAB_00ce3e01;
              iVar9 = (uint)puVar20[lVar16 * 4] - (uint)*(byte *)(uVar13 + lVar16 * 4);
              bVar6 = (byte)iVar9;
              bVar15 = -bVar6;
              if (0 < iVar9) {
                bVar15 = bVar6;
              }
              if (1 < bVar15) goto LAB_00ce3e01;
            }
            else {
LAB_00ce3e01:
              slice_pixels_ptr[0] =
                   (uchar *)((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                            m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::operator<<((ostream *)this_00,"(layer=");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00," x=");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00," y=");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,") ");
              std::operator<<((ostream *)this_00,
                              "Reference value is different than the rendered data (epsilon > ");
              std::ostream::operator<<(this_00,1);
              std::operator<<((ostream *)this_00,"): ");
              std::operator<<((ostream *)this_00,"(");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,") vs ");
              std::operator<<((ostream *)this_00,"(");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", ");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,").");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)slice_pixels_ptr,
                         (EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              bVar8 = true;
            }
          }
          puVar20 = puVar20 + 4;
          uVar13 = uVar13 + 4;
        }
        lVar18 = lVar18 + 1;
      } while (!bVar8);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Pixel data comparison failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,0x16a);
    }
    else {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Could not build program object",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                 ,0xc9);
    }
    ppuVar17 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar17,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferBlending::iterate(void)
{
/* Test-wide constants */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (4)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(0.2);\n"
						  "}\n";

	/* Geometry shader code */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "layout(points)                          in;\n"
						  "layout(triangle_strip, max_vertices=64) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, 1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Layer    = n;\n"
						  "        gl_Position = vec4(-1, -1, 0, 1);\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "}\n";

	/* General variables */
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	unsigned int		  n			  = 0;
	unsigned int		  n_component = 0;
	unsigned int		  n_layer	 = 0;
	unsigned int		  n_slice	 = 0;
	unsigned int		  x			  = 0;
	unsigned int		  y			  = 0;

	unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice1[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice2[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice3[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];
	unsigned char ref_buffer_slice4[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS];

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Set up shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate shader objects");

	/* Set up program objects */
	m_po_id = gl.createProgram();

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fs_code, m_gs_id, 1 /* part */, &gs_code, m_vs_id, 1 /* part */,
					  &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build program object");
	}

	/* Prepare texture data we will use for each slice */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			slice_pixels_ptr[n_slice][0] = 0;
			slice_pixels_ptr[n_slice][1] = (unsigned char)(n_slice * 255 / 4);
			slice_pixels_ptr[n_slice][2] = (unsigned char)(n_slice * 255 / 8);
			slice_pixels_ptr[n_slice][3] = (unsigned char)(n_slice * 255 / 12);
		} /* for (all slices) */
	}	 /* for (all pixels) */

	/* Calculate reference texture data we will later use when verifying the rendered data */
	for (n = 0; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
	{
		unsigned char* ref_slice_pixels_ptr[] = { ref_buffer_slice1 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice2 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice3 + n * N_TEXTURE_COMPONENTS,
												  ref_buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		unsigned char* slice_pixels_ptr[] = { buffer_slice1 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice2 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice3 + n * N_TEXTURE_COMPONENTS,
											  buffer_slice4 + n * N_TEXTURE_COMPONENTS };

		for (n_slice = 0; n_slice < sizeof(slice_pixels_ptr) / sizeof(slice_pixels_ptr[0]); ++n_slice)
		{
			unsigned char* ref_slice_ptr = ref_slice_pixels_ptr[n_slice];
			unsigned char* slice_ptr	 = slice_pixels_ptr[n_slice];
			float		   slice_rgba[]  = {
				float(slice_ptr[0]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[1]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[2]) / 255.0f, /* convert to FP representation */
				float(slice_ptr[3]) / 255.0f  /* convert to FP representation */
			};

			for (n_component = 0; n_component < N_TEXTURE_COMPONENTS; ++n_component)
			{
				float temp_component = slice_rgba[n_component] /* dst_color */ * slice_rgba[n_component] /* dst_color */
									   + 0.8f /* 1-src_color */ * 0.2f /* src_color */;

				/* Clamp if necessary */
				if (temp_component < 0)
				{
					temp_component = 0.0f;
				}
				else if (temp_component > 1)
				{
					temp_component = 1.0f;
				}

				/* Convert back to GL_RGBA8 */
				ref_slice_ptr[n_component] = (unsigned char)(temp_component * 255.0f);
			} /* for (all components) */
		}	 /* for (all slices) */
	}		  /* for (all pixels) */

	/* Set up texture object used for the test */
	gl.genTextures(1, &m_to_id);
	gl.bindTexture(GL_TEXTURE_3D, m_to_id);
	gl.texStorage3D(GL_TEXTURE_3D, 1 /* levels */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice1);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice2);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice3);
	gl.texSubImage3D(GL_TEXTURE_3D, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */, TEXTURE_WIDTH,
					 TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, buffer_slice4);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object");

	/* Set up framebuffer object used for the test */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer");

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up vertex array object");

	/* Set up blending */
	gl.blendFunc(GL_ONE_MINUS_SRC_COLOR, GL_DST_COLOR);
	gl.enable(GL_BLEND);

	/* Render */
	gl.useProgram(m_po_id);
	gl.viewport(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed");

	/* Verify rendered data in the layers */
	gl.genFramebuffers(1, &m_read_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);

	for (n_layer = 0; n_layer < TEXTURE_DEPTH; ++n_layer)
	{
		bool has_layer_failed = false;

		const unsigned char* ref_buffer =
			(n_layer == 0) ?
				ref_buffer_slice1 :
				(n_layer == 1) ? ref_buffer_slice2 : (n_layer == 2) ? ref_buffer_slice3 : ref_buffer_slice4;

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */, n_layer);
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixel data!");

		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			const unsigned int   pixel_size = N_TEXTURE_COMPONENTS;
			const unsigned char* ref_row	= ref_buffer + y * pixel_size;
			const unsigned char* row		= buffer + y * pixel_size;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
#define EPSILON (1)

				const unsigned char* data	 = row + x * pixel_size;
				const unsigned char* ref_data = ref_row + x * pixel_size;

				if (de::abs((int)data[0] - (int)ref_data[0]) > EPSILON ||
					de::abs((int)data[1] - (int)ref_data[1]) > EPSILON ||
					de::abs((int)data[2] - (int)ref_data[2]) > EPSILON ||
					de::abs((int)data[3] - (int)ref_data[3]) > EPSILON)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(layer=" << n_layer << " x=" << x << " y=" << y
									   << ") "
									   << "Reference value is different than the rendered data (epsilon > " << EPSILON
									   << "): "
									   << "(" << (unsigned int)ref_data[0] << ", " << (unsigned int)ref_data[1] << ", "
									   << (unsigned int)ref_data[2] << ", " << (unsigned int)ref_data[3] << ") vs "
									   << "(" << (unsigned int)data[0] << ", " << (unsigned int)data[1] << ", "
									   << (unsigned int)data[2] << ", " << (unsigned int)data[3] << ")."
									   << tcu::TestLog::EndMessage;

					has_layer_failed = true;
				} /* if (regions are different) */

#undef EPSILON
			} /* for (all pixels in a row) */
		}	 /* for (all rows) */

		if (has_layer_failed)
		{
			TCU_FAIL("Pixel data comparison failed");
		}
	} /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}